

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

BOOL FlushInstructionCache(HANDLE hProcess,LPCVOID lpBaseAddress,SIZE_T dwSize)

{
  BOOL BVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpBaseAddress == (LPCVOID)0x0) {
      BVar1 = 1;
    }
    else {
      BVar1 = DBG_FlushInstructionCache(lpBaseAddress,dwSize);
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
      return BVar1;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
FlushInstructionCache(
        IN HANDLE hProcess,
        IN LPCVOID lpBaseAddress,
        IN SIZE_T dwSize)
{
    BOOL Ret;

    PERF_ENTRY(FlushInstructionCache);
    ENTRY("FlushInstructionCache (hProcess=%p, lpBaseAddress=%p dwSize=%d)\
          \n", hProcess, lpBaseAddress, dwSize);

    if (lpBaseAddress != NULL)
    {
        Ret = DBG_FlushInstructionCache(lpBaseAddress, dwSize);
    }
    else
    {
        Ret = TRUE;
    }

    LOGEXIT("FlushInstructionCache returns BOOL %d\n", Ret);
    PERF_EXIT(FlushInstructionCache);
    return Ret;
}